

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::FunctionCallVar::FunctionCallVar
          (FunctionCallVar *this,Generator *m,shared_ptr<kratos::FunctionStmtBlock> *func_def,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          *args,bool has_return)

{
  ulong uVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  pair<unsigned_int,_unsigned_int> pVar10;
  VarException *pVVar11;
  UserException *this_00;
  StmtException *this_01;
  shared_ptr<kratos::BuiltInFunctionStmtBlock> *this_02;
  undefined7 in_register_00000081;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar12;
  byte bVar13;
  basic_string_view<char> bVar14;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  undefined1 local_108 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_c8;
  undefined4 local_ac;
  undefined1 local_a8 [8];
  shared_ptr<kratos::BuiltInFunctionStmtBlock> builtin;
  shared_ptr<kratos::Var> handle;
  shared_ptr<kratos::DPIFunctionStmtBlock> dpi;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  allocator_type local_39;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_ac = (undefined4)CONCAT71(in_register_00000081,has_return);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"",
             (allocator<char> *)
             &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  aVar12.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,m,(string *)local_108,1,1,false);
  std::__cxx11::string::~string((string *)local_108);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b3a60;
  this->func_def_ =
       (func_def->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&this->args_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
              *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count,&args->_M_t);
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)local_108,
             &(((func_def->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->ports_)._M_t);
  for (p_Var9 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 != (_Rb_tree_node_base *)&ports; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
            ::find(&args->_M_t,(key_type *)(p_Var9 + 1));
    if ((_Rb_tree_header *)cVar7._M_node == &(args->_M_t)._M_impl.super__Rb_tree_header) {
      pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 1);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var9[1]._M_parent;
      bVar14 = fmt::v7::to_string_view<char,_0>("{0} is not connected");
      format_str.data_ = (char *)bVar14.size_;
      format_str.size_ = 0xd;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = aVar12.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (detail *)bVar14.data_,format_str,args_00);
      local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 2);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_c8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_68,__l,
                 (allocator_type *)
                 &builtin.
                  super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      VarException::VarException
                (pVVar11,(string *)
                         &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_68);
      __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
             ::at(args,(key_type *)(p_Var9 + 1));
    iVar4 = (**(code **)(**(long **)(p_Var9 + 2) + 0x38))();
    iVar5 = (*(((pmVar8->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    if (iVar4 != iVar5) {
      pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 1);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var9[1]._M_parent;
      bVar14 = fmt::v7::to_string_view<char,_0>("{0}\'s width doesn\'t match");
      format_str_01.data_ = (char *)bVar14.size_;
      format_str_01.size_ = 0xd;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = aVar12.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (detail *)bVar14.data_,format_str_01,args_02);
      local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 2);
      local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(pmVar8->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&local_c8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_68,__l_01,
                 (allocator_type *)
                 &builtin.
                  super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      VarException::VarException
                (pVVar11,(string *)
                         &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_68);
      __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((bool)*(char *)(*(long *)(p_Var9 + 2) + 0xf0) !=
        ((pmVar8->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->is_signed_)
    {
      pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 1);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var9[1]._M_parent;
      bVar14 = fmt::v7::to_string_view<char,_0>("{0}\'s sign doesn\'t match");
      format_str_00.data_ = (char *)bVar14.size_;
      format_str_00.size_ = 0xd;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar12.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (detail *)bVar14.data_,format_str_00,args_01);
      local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 2);
      local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(pmVar8->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_c8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_68,__l_00,
                 (allocator_type *)
                 &builtin.
                  super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      VarException::VarException
                (pVVar11,(string *)
                         &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_68);
      __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &builtin.
              super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(((func_def->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->function_handler_).
              super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  _Var2._M_pi = local_38._M_pi;
  bVar13 = (byte)local_ac;
  if ((builtin.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 & bVar13) != 0) {
    iVar4 = (*(((func_def->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])();
    if ((char)iVar4 == '\0') {
      iVar4 = (*(((func_def->
                  super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
      if ((char)iVar4 == '\0') {
        iVar4 = (*(((func_def->
                    super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x11])();
        if ((char)iVar4 == '\0') {
          this_01 = (StmtException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_68,
                     (string *)
                     &((func_def->
                       super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->function_name_);
          local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_68.
               super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          bVar14 = fmt::v7::to_string_view<char,_0>("{0} doesn\'t have return value");
          format_str_03.data_ = (char *)bVar14.size_;
          format_str_03.size_ = 0xd;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = aVar12.args_;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_c8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)
                     &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ,(detail *)bVar14.data_,format_str_03,args_04);
          local_a8 = (undefined1  [8])
                     (func_def->
                     super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
          __l_02._M_len = 1;
          __l_02._M_array = (iterator)local_a8;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    (&local_c8,__l_02,&local_39);
          StmtException::StmtException
                    (this_01,(string *)
                             &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,&local_c8);
          __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
  }
  if (bVar13 != 0) {
    iVar4 = (*(((func_def->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
    if ((char)iVar4 == '\0') {
      iVar4 = (*(((func_def->
                  super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])();
      if ((char)iVar4 == '\0') {
        if (builtin.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar4 = (*(builtin.
                     super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_vptr__Sp_counted_base[7])();
          _Var2._M_pi[9]._M_use_count = iVar4;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(_Var2._M_pi + 10),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (builtin.
                      super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + 10));
          *(bool *)&_Var2._M_pi[0xf]._vptr__Sp_counted_base =
               *(bool *)&builtin.
                         super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi[0xf]._vptr__Sp_counted_base;
        }
        goto LAB_00185394;
      }
      Stmt::as<kratos::DPIFunctionStmtBlock>
                ((Stmt *)&handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      iVar4 = *(int *)(CONCAT44(handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_,
                                handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._0_4_) + 0x180);
      if (iVar4 != 0) {
        _Var2._M_pi[9]._M_use_count = iVar4;
        local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_68.
                               super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)(_Var2._M_pi + 10),&local_68
                  );
        *(bool *)&_Var2._M_pi[0xf]._vptr__Sp_counted_base = false;
      }
      this_02 = (shared_ptr<kratos::BuiltInFunctionStmtBlock> *)&dpi;
    }
    else {
      Stmt::as<kratos::BuiltInFunctionStmtBlock>((Stmt *)local_a8);
      uVar6 = BuiltInFunctionStmtBlock::return_width((BuiltInFunctionStmtBlock *)local_a8);
      if (uVar6 != 0) {
        uVar6 = BuiltInFunctionStmtBlock::return_width((BuiltInFunctionStmtBlock *)local_a8);
        _Var2._M_pi[9]._M_use_count = uVar6;
        handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
             1;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)(_Var2._M_pi + 10),
                   &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        bVar3 = BuiltInFunctionStmtBlock::is_signed((BuiltInFunctionStmtBlock *)local_a8);
        *(bool *)&_Var2._M_pi[0xf]._vptr__Sp_counted_base = bVar3;
        pVar10 = BuiltInFunctionStmtBlock::num_args((BuiltInFunctionStmtBlock *)local_a8);
        uVar1 = (args->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        if ((uVar1 < ((ulong)pVar10 & 0xffffffff)) || ((ulong)pVar10 >> 0x20 < uVar1)) {
          this_00 = (UserException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_68,
                     (string *)
                     &((func_def->
                       super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->function_name_);
          local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_68.
               super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_c8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          bVar14 = fmt::v7::to_string_view<char,_0>("Invalid number of arguments to function {0}");
          format_str_02.data_ = (char *)bVar14.size_;
          format_str_02.size_ = 0xd;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = aVar12.args_;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_c8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)
                     &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ,(detail *)bVar14.data_,format_str_02,args_03);
          UserException::UserException
                    (this_00,(string *)
                             &handle.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      this_02 = &builtin;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_02);
  }
LAB_00185394:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&handle);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
               *)local_108);
  return;
}

Assistant:

FunctionCallVar::FunctionCallVar(Generator *m, const std::shared_ptr<FunctionStmtBlock> &func_def,
                                 const std::map<std::string, std::shared_ptr<Var>> &args,
                                 bool has_return)
    : Var(m, "", 1, 1, false), func_def_(func_def.get()), args_(args) {
    // check the function call types
    auto ports = func_def->ports();
    for (auto const &[port_name, func_port] : ports) {
        if (args.find(port_name) == args.end()) {
            throw VarException(::format("{0} is not connected", port_name), {func_port.get()});
        }
        // check the port types
        auto const &arg_port = args.at(port_name);
        if (func_port->width() != arg_port->width())
            throw VarException(::format("{0}'s width doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
        if (func_port->is_signed() != arg_port->is_signed())
            throw VarException(::format("{0}'s sign doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
    }
    // compute the width and sign
    auto handle = func_def->function_handler();
    if (!handle && has_return && !func_def->is_dpi() && !func_def->is_builtin() &&
        !func_def->is_task())
        throw StmtException(::format("{0} doesn't have return value", func_def->function_name()),
                            {func_def.get()});
    if (has_return && func_def->is_builtin()) {
        auto builtin = func_def->as<BuiltInFunctionStmtBlock>();
        if (builtin->return_width()) {
            var_width_ = builtin->return_width();
            size_ = {1};
            is_signed_ = builtin->is_signed();
            auto [min_arg, max_arg] = builtin->num_args();
            auto num_arg = args.size();
            if (num_arg < min_arg || num_arg > max_arg) {
                throw UserException(fmt::format("Invalid number of arguments to function {0}",
                                                func_def->function_name()));
            }
        }
        // check num of args
    } else if (has_return && func_def->is_dpi()) {
        auto dpi = func_def->as<DPIFunctionStmtBlock>();
        if (dpi->return_width()) {
            var_width_ = dpi->return_width();
            // FIXME: always size 1?
            size_ = {1};
            is_signed_ = false;
        }
    } else if (has_return && handle != nullptr) {
        var_width_ = handle->width();
        size_ = handle->size();
        is_signed_ = handle->is_signed();
    }
}